

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_user_agent(session_impl *this)

{
  bool bVar1;
  string *psVar2;
  reference pcVar3;
  string local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70 [3];
  char local_51;
  char *local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  iterator i;
  string agent;
  session_impl *this_local;
  
  psVar2 = session_settings::get_str_abi_cxx11_(&this->m_settings,0);
  ::std::__cxx11::string::string((string *)&i,(string *)psVar2);
  local_38._M_current = (char *)::std::__cxx11::string::begin();
  while( true ) {
    local_48._M_current = local_38._M_current;
    local_50 = (char *)::std::__cxx11::string::end();
    local_51 = '\n';
    local_40 = (char *)::std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                 (local_48,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )local_50,&local_51);
    local_38 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_40;
    local_70[0]._M_current = (char *)::std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_38,local_70);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    *pcVar3 = ' ';
  }
  ::std::__cxx11::string::string((string *)&local_90,(string *)&i);
  session_settings::set_str(&this->m_settings,0,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void session_impl::update_user_agent()
	{
		// replace all occurrences of '\n' with ' '.
		std::string agent = m_settings.get_str(settings_pack::user_agent);
		std::string::iterator i = agent.begin();
		while ((i = std::find(i, agent.end(), '\n'))
			!= agent.end())
			*i = ' ';
		m_settings.set_str(settings_pack::user_agent, agent);
	}